

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O1

bool ON_IsKnotVectorUniform(int order,int cv_count,double *knot)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  if ((order > cv_count || 1 >= order) || knot == (double *)0x0) {
    return (order <= cv_count && 1 < order) && knot != (double *)0x0;
  }
  dVar4 = knot[(long)order + -1] - knot[(long)order + -2];
  bVar1 = (bool)(dVar4 < 1.23432101234321e+308 & -(dVar4 != 0.0) & -(-1.23432101234321e+308 < dVar4)
                );
  if (bVar1 != true) {
    return bVar1;
  }
  iVar2 = 1;
  if (1 < order && order <= cv_count) {
    iVar2 = order;
    if (*knot != knot[(ulong)(uint)order - 2]) {
      iVar2 = 1;
    }
    if (NAN(*knot) || NAN(knot[(ulong)(uint)order - 2])) {
      iVar2 = 1;
    }
  }
  if (order <= cv_count && 1 < order) {
    if ((knot[(long)cv_count + -1] == knot[(long)(cv_count + order) + -3]) &&
       (!NAN(knot[(long)cv_count + -1]) && !NAN(knot[(long)(cv_count + order) + -3])))
    goto LAB_004c1ca4;
  }
  cv_count = cv_count + order + -2;
LAB_004c1ca4:
  bVar1 = true;
  if (iVar2 < cv_count) {
    dVar5 = knot[(long)iVar2 + -1];
    lVar3 = (long)iVar2;
    do {
      dVar6 = ABS((knot[lVar3] - dVar5) - dVar4);
      bVar1 = dVar6 <= ABS(dVar4 * 1.490116119385e-08);
      if ((long)cv_count <= lVar3 + 1) {
        return bVar1;
      }
      dVar5 = knot[lVar3];
      lVar3 = lVar3 + 1;
    } while (dVar6 <= ABS(dVar4 * 1.490116119385e-08));
  }
  return bVar1;
}

Assistant:

bool ON_IsKnotVectorUniform(
          int order,
          int cv_count,
          const double* knot 
          )
{
  bool rc = (order >= 2 && cv_count >= order && 0 != knot);
  if (rc)
  {
    const double delta = knot[order-1] - knot[order-2];
    rc = (0.0 != delta && delta > ON_UNSET_VALUE && delta < ON_UNSET_POSITIVE_VALUE);
    if (rc)
    {
      const int i0 = ON_IsKnotVectorClamped(order, cv_count, knot, 0) ? order : 1;
      const int i1 = ON_IsKnotVectorClamped(order, cv_count, knot, 1) ? cv_count : ON_KnotCount(order, cv_count);
      double k0 = knot[i0 - 1];
      const double delta_tol = fabs(ON_SQRT_EPSILON*delta);
      for (int i = i0; i < i1 && rc; ++i)
      {
        const double d = knot[i] - k0;
        rc = fabs(d - delta) <= delta_tol;
        k0 = knot[i];
      }
    }
  }
  return rc;
}